

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O2

boolean enexto_core_range(coord *cc,level *lev,xchar xx,xchar yy,permonst *mdat,uint entflags,
                         int start_range)

{
  boolean bVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int x;
  int iVar6;
  int x_00;
  int iVar7;
  int iVar8;
  bool bVar9;
  coord good [15];
  monst fakemon;
  
  fakemon.data = mons + u.umonster;
  if (mdat != (permonst *)0x0) {
    fakemon.data = mdat;
  }
  do {
    iVar3 = (int)CONCAT71(in_register_00000011,xx);
    x = iVar3 - start_range;
    if (x < 2) {
      x = 1;
    }
    iVar3 = start_range + iVar3;
    if (0x4e < iVar3) {
      iVar3 = 0x4f;
    }
    iVar8 = (int)CONCAT71(in_register_00000009,yy);
    iVar7 = iVar8 - start_range;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    iVar8 = start_range + iVar8;
    if (0x13 < iVar8) {
      iVar8 = 0x14;
    }
    uVar5 = 0;
    for (iVar6 = x; x_00 = x, iVar6 <= iVar3; iVar6 = iVar6 + 1) {
      bVar1 = goodpos(lev,iVar6,iVar7,&fakemon,entflags);
      uVar4 = uVar5;
      if (bVar1 != '\0') {
        (&good[0].x)[uVar5] = (xchar)iVar6;
        (&good[0].y)[uVar5] = (xchar)iVar7;
        uVar4 = uVar5 + 2;
        if (uVar5 == 0x1c) goto LAB_0024756f;
      }
      uVar5 = uVar4;
    }
    for (; uVar4 = uVar5, x_00 <= iVar3; x_00 = x_00 + 1) {
      bVar1 = goodpos(lev,x_00,iVar8,&fakemon,entflags);
      if (bVar1 != '\0') {
        (&good[0].x)[uVar5] = (xchar)x_00;
        (&good[0].y)[uVar5] = (xchar)iVar8;
        uVar4 = uVar5 + 2;
        if (uVar5 == 0x1c) goto LAB_0024756f;
      }
      uVar5 = uVar4;
    }
    iVar7 = iVar7 + 1;
    for (iVar6 = iVar7; iVar6 < iVar8; iVar6 = iVar6 + 1) {
      bVar1 = goodpos(lev,x,iVar6,&fakemon,entflags);
      uVar5 = uVar4;
      if (bVar1 != '\0') {
        (&good[0].x)[uVar4] = (xchar)x;
        (&good[0].y)[uVar4] = (xchar)iVar6;
        uVar5 = uVar4 + 2;
        bVar9 = uVar4 == 0x1c;
        uVar4 = uVar5;
        if (bVar9) goto LAB_0024756f;
      }
      uVar4 = uVar5;
    }
    for (; iVar7 < iVar8; iVar7 = iVar7 + 1) {
      bVar1 = goodpos(lev,iVar3,iVar7,&fakemon,entflags);
      uVar5 = uVar4;
      if (bVar1 != '\0') {
        (&good[0].x)[uVar4] = (xchar)iVar3;
        (&good[0].y)[uVar4] = (xchar)iVar7;
        uVar5 = uVar4 + 2;
        bVar9 = uVar4 == 0x1c;
        uVar4 = uVar5;
        if (bVar9) goto LAB_0024756f;
      }
      uVar4 = uVar5;
    }
    if (0x4f < start_range) {
      return '\0';
    }
    start_range = start_range + 1;
  } while (uVar4 == 0);
LAB_0024756f:
  uVar2 = rn2((int)(uVar4 >> 1));
  cc->x = good[uVar2].x;
  cc->y = good[uVar2].y;
  return '\x01';
}

Assistant:

boolean enexto_core_range(coord *cc, struct level *lev, xchar xx, xchar yy,
			  const struct permonst *mdat, unsigned entflags,
			  int start_range) /* distance to begin tile check (>= 1) */
{
#define MAX_GOOD 15
    coord good[MAX_GOOD], *good_ptr;
    int x, y, range, i;
    int xmin, xmax, ymin, ymax;
    struct monst fakemon;	/* dummy monster */

    if (!mdat) {
	/* default to player's original monster type */
	mdat = &mons[u.umonster];
    }
    
    fakemon.data = mdat;	/* set up for goodpos */
    good_ptr = good;
    range = start_range;
    /*
     * Walk around the border of the square with center (xx,yy) and
     * radius range.  Stop when we find at least one valid position.
     */
    do {
	xmin = max(1, xx-range);
	xmax = min(COLNO-1, xx+range);
	ymin = max(0, yy-range);
	ymax = min(ROWNO-1, yy+range);

	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymin, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymin ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymax, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymax ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmin, y, &fakemon, entflags)) {
		good_ptr->x = xmin;
		good_ptr-> y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmax, y, &fakemon, entflags)) {
		good_ptr->x = xmax;
		good_ptr->y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	range++;

	/* return if we've grown too big (nothing is valid) */
	if (range > ROWNO && range > COLNO) return FALSE;
    } while (good_ptr == good);

full:
    i = rn2((int)(good_ptr - good));
    cc->x = good[i].x;
    cc->y = good[i].y;
    return TRUE;
}